

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_base.cpp
# Opt level: O3

void __thiscall
zmq::socket_base_t::attach_pipe
          (socket_base_t *this,pipe_t *pipe_,bool subscribe_to_all_,bool locally_initiated_)

{
  bool bVar1;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  
  pipe_t::set_event_sink(pipe_,&this->super_i_pipe_events);
  array_t<zmq::pipe_t,_3>::push_back(&this->_pipes,pipe_);
  (*(this->super_own_t).super_object_t._vptr_object_t[0x20])
            (this,pipe_,CONCAT71(in_register_00000011,subscribe_to_all_) & 0xffffffff,
             CONCAT71(in_register_00000009,locally_initiated_) & 0xffffffff);
  bVar1 = own_t::is_terminating(&this->super_own_t);
  if (bVar1) {
    own_t::register_term_acks(&this->super_own_t,1);
    pipe_t::terminate(pipe_,false);
    return;
  }
  return;
}

Assistant:

void zmq::socket_base_t::attach_pipe (pipe_t *pipe_,
                                      bool subscribe_to_all_,
                                      bool locally_initiated_)
{
    //  First, register the pipe so that we can terminate it later on.
    pipe_->set_event_sink (this);
    _pipes.push_back (pipe_);

    //  Let the derived socket type know about new pipe.
    xattach_pipe (pipe_, subscribe_to_all_, locally_initiated_);

    //  If the socket is already being closed, ask any new pipes to terminate
    //  straight away.
    if (is_terminating ()) {
        register_term_acks (1);
        pipe_->terminate (false);
    }
}